

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

float compare(vector<float,_std::allocator<float>_> *fv1,vector<float,_std::allocator<float>_> *fv2)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pfVar3 = (fv1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar8 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  lVar4 = (long)(fv1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar3;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 2;
    lVar5 = 0;
    do {
      fVar1 = pfVar3[lVar5];
      fVar2 = (fv2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      fVar7 = fVar7 + fVar1 * fVar2;
      fVar6 = fVar6 + fVar1 * fVar1;
      fVar8 = fVar8 + fVar2 * fVar2;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar6 = acosf(fVar7 / (fVar6 * fVar8));
  return fVar6 / 3.1415927;
}

Assistant:

float compare(vector<float> &fv1, vector<float> &fv2){
    float dot = 0;
    float sum2 = 0;
    float sum3 = 0;
    for(int i = 0; i < fv1.size(); i++){
        dot += fv1[i]*fv2[i];
        sum2 += pow(fv1[i], 2);
        sum3 += pow(fv2[i], 2);
    }
    float norm = sqrt(sum2)*sqrt(sum3);
    float similary = dot / norm;
    float dist = acos(similary) / CV_PI;
    return dist;
}